

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

date_t duckdb::TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::
       Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                 (interval_t bucket_width,date_t ts,interval_t offset)

{
  bool bVar1;
  date_t dVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Interval *pIVar7;
  int64_t extraout_RDX;
  int right;
  int64_t iVar9;
  int right_00;
  undefined1 auVar10 [12];
  interval_t iVar11;
  interval_t right_01;
  interval_t right_02;
  date_t result;
  date_t local_44;
  string local_40;
  ulong uVar8;
  
  iVar9 = offset.micros;
  pIVar7 = offset._0_8_;
  bVar1 = Value::IsFinite<duckdb::date_t>(ts);
  if (!bVar1) {
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(ts,&local_44,false);
    if (bVar1) {
      return (date_t)local_44.days;
    }
    auVar10 = __cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::date_t,duckdb::date_t>
              (&local_40,(duckdb *)(ulong)(uint)ts.days,(date_t)auVar10._8_4_);
    InvalidInputException::InvalidInputException(auVar10._0_8_,&local_40);
    __cxa_throw(auVar10._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
    ;
  }
  iVar11.micros = extraout_RDX;
  iVar11.months = (int)iVar9;
  iVar11.days = (int)((ulong)iVar9 >> 0x20);
  iVar11 = Interval::Invert(offset._0_8_,iVar11);
  right_01._0_8_ = iVar11.micros;
  right_01.micros = (int64_t)pIVar7;
  dVar2 = Interval::Add((Interval *)(ulong)(uint)ts.days,iVar11.months,right_01);
  iVar3 = EpochMonths<duckdb::date_t>(dVar2);
  right_00 = bucket_width.months;
  right = (int)(0x168 % (long)right_00);
  iVar4 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar3,right);
  iVar5 = iVar4 - iVar4 % right_00;
  if (iVar4 % right_00 != 0 && iVar4 < 0) {
    iVar5 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar5,right_00);
  }
  iVar5 = iVar5 + right;
  uVar6 = iVar5 % 0xc;
  uVar8 = (ulong)uVar6;
  if (uVar6 == 0 || -1 < iVar5) {
    iVar3 = iVar5 / 0xc + 0x7b2;
    iVar4 = 1;
    if (-1 < iVar5) goto LAB_00f40524;
  }
  else {
    iVar3 = 0x7b1 - (uint)-iVar5 / 0xc;
  }
  iVar4 = 0xd;
  if (uVar6 == 0) {
    iVar4 = 1;
  }
LAB_00f40524:
  dVar2 = Date::FromDate(iVar3,iVar4 + uVar6,1);
  bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(dVar2,&local_44,false);
  if (bVar1) {
    right_02.micros = uVar8;
    right_02.months = (int)iVar9;
    right_02.days = (int)((ulong)iVar9 >> 0x20);
    dVar2 = Interval::Add((Interval *)(ulong)(uint)local_44.days,offset.months,right_02);
    return (date_t)dVar2.days;
  }
  auVar10 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::date_t,duckdb::date_t>
            (&local_40,(duckdb *)(ulong)(uint)dVar2.days,(date_t)auVar10._8_4_);
  InvalidInputException::InvalidInputException(auVar10._0_8_,&local_40);
  __cxa_throw(auVar10._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(Interval::Add(ts, Interval::Invert(offset)));
			return Interval::Add(Cast::template Operation<date_t, TR>(WidthConvertibleToMonthsCommon(
			                         bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS)),
			                     offset);
		}